

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O2

uint __thiscall
xercesc_4_0::DFAContentModel::countLeafNodes(DFAContentModel *this,ContentSpecNode *curNode)

{
  ContentSpecNode *curNode_00;
  ContentSpecNode *pCVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  NodeTypes NVar6;
  uint uVar7;
  ContentSpecNode *curNode_01;
  bool bVar8;
  
  NVar6 = curNode->fType;
  uVar5 = 1;
  if ((((NVar6 & (Any_NS|Any_Other)) != Any_NS && (NVar6 & (Any_NS|Any)) != Any) && (NVar6 != Leaf))
     && (NVar6 != Loop)) {
    curNode_00 = curNode->fSecond;
    uVar7 = 0;
    curNode_01 = curNode;
    while (((NVar6 == Sequence && (pCVar1 = curNode_01->fFirst, pCVar1 != (ContentSpecNode *)0x0))
           && (pCVar1->fSecond == curNode_00))) {
      uVar7 = uVar7 + 1;
      NVar6 = pCVar1->fType;
      curNode_01 = pCVar1;
    }
    if (uVar7 == 0) {
      if (curNode->fFirst == (ContentSpecNode *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = countLeafNodes(this,curNode->fFirst);
      }
      if (curNode_00 != (ContentSpecNode *)0x0) {
        uVar7 = countLeafNodes(this,curNode_00);
        bVar8 = CARRY4(uVar7,uVar5);
        uVar5 = uVar7 + uVar5;
        if (bVar8) goto LAB_002e3faf;
      }
    }
    else {
      uVar2 = countLeafNodes(this,curNode_01);
      uVar3 = countLeafNodes(this,curNode_00);
      if (((int)((ulong)uVar7 * (ulong)uVar3 >> 0x20) != 0) ||
         (uVar5 = uVar3 * uVar7 + uVar2, CARRY4(uVar3 * uVar7,uVar2))) {
LAB_002e3faf:
        uVar4 = __cxa_allocate_exception(1);
        __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,
                    OutOfMemoryException::~OutOfMemoryException);
      }
    }
  }
  return uVar5;
}

Assistant:

bool DFAContentModel::validateContentSpecial(QName** const            children
                                            , XMLSize_t               childCount
                                            , unsigned int
                                            , GrammarResolver*  const pGrammarResolver
                                            , XMLStringPool*    const pStringPool
                                            , XMLSize_t*              indexFailingChild
                                            , MemoryManager*    const) const
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    if (childCount == 0)
    {
        if(fEmptyOk)
            return true;
        *indexFailingChild=0;
        return false;
    }

    //
    //  Lets loop through the children in the array and move our way
    //  through the states. Note that we use the fElemMap array to map
    //  an element index to a state index.
    //
    unsigned int curState = 0;
    unsigned int loopCount = 0;
    unsigned int nextState = 0;
    unsigned int childIndex = 0;
    for (; childIndex < childCount; childIndex++)
    {
        // Get the current element index out
        QName* curElem = children[childIndex];

        // If this is text in a Schema mixed content model, skip it.
        if ( fIsMixed &&
            ( curElem->getURI() == XMLElementDecl::fgPCDataElemId))
            continue;

        // Look up this child in our element map
        unsigned int elemIndex = 0;
        for (; elemIndex < fElemMapSize; elemIndex++)
        {
            QName* inElem  = fElemMap[elemIndex];
            ContentSpecNode::NodeTypes type = fElemMapType[elemIndex];
            if (type == ContentSpecNode::Leaf)
            {
                if (comparator.isEquivalentTo(curElem, inElem) )
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }

            }
            else if ((type & 0x0f)== ContentSpecNode::Any)
            {
                nextState = fTransTable[curState][elemIndex];
                if (nextState != XMLContentModel::gInvalidTrans)
                    break;
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_NS)
            {
                if (inElem->getURI() == curElem->getURI())
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_Other)
            {
                // Here we assume that empty string has id 1.
                //
                unsigned int uriId = curElem->getURI();
                if (uriId != 1 && uriId != inElem->getURI())
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
        }//for elemIndex

        // If "nextState" is -1, we found a match, but the transition is invalid
        if (nextState == XMLContentModel::gInvalidTrans)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        // If we didn't find it, then obviously not valid
        if (elemIndex == fElemMapSize)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        unsigned int nextLoop = 0;
        if(!handleRepetitions(curElem, curState, loopCount, nextState, nextLoop, elemIndex, &comparator))
        {
            *indexFailingChild=childIndex;
            return false;
        }

        curState = nextState;
        loopCount = nextLoop;
        nextState = 0;

    }//for childIndex

    //
    //  We transitioned all the way through the input list. However, that
    //  does not mean that we ended in a final state. So check whether
    //  our ending state is a final state.
    //
    if (!fFinalStateFlags[curState])
    {
        *indexFailingChild=childIndex;
        return false;
    }

    // verify if we exited before the minOccurs was satisfied
    if (fCountingStates != 0) {
        Occurence* o = fCountingStates[curState];
        if (o != 0) {
            if (loopCount < (unsigned int)o->minOccurs) {
                // not enough loops on the current state.
                *indexFailingChild=childIndex;
                return false;
            }
        }
    }

    //success
    return true;
}